

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeTrackerDevice.cpp
# Opt level: O0

void __thiscall
MinVR::VRFakeTrackerDevice::onVREvent(VRFakeTrackerDevice *this,VRDataIndex *eventData)

{
  byte bVar1;
  __type _Var2;
  bool bVar3;
  VRAnyCoreType v;
  const_reference pvVar4;
  VRVector3 *in_RSI;
  VRDataIndex *in_RDI;
  VRDataIndex di;
  VRMatrix4 r_1;
  VRVector3 over;
  VRPoint3 here;
  VRVector3 up;
  VRMatrix4 r;
  float deltaY;
  float deltaX;
  float mousey;
  float mousex;
  VRFloatArray screenPos;
  VRDataIndex *in_stack_fffffffffffff798;
  VRMatrix4 *in_stack_fffffffffffff7a0;
  float zz;
  VRDataIndex *this_00;
  float in_stack_fffffffffffff7a8;
  float in_stack_fffffffffffff7ac;
  float xx;
  undefined4 in_stack_fffffffffffff7b0;
  float in_stack_fffffffffffff7b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c4;
  VRMatrix4 *in_stack_fffffffffffff7c8;
  allocator<char> *in_stack_fffffffffffff7d0;
  char *in_stack_fffffffffffff7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e0;
  VRVector3 *this_01;
  VRDataIndex *event;
  VRMatrix4 *m2;
  undefined4 in_stack_fffffffffffff808;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte local_7ef;
  byte local_7ed;
  undefined7 in_stack_fffffffffffff820;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff8d0;
  string *in_stack_fffffffffffff8d8;
  VRMatrix4 local_690;
  undefined1 in_stack_fffffffffffff9f7;
  string *in_stack_fffffffffffff9f8;
  VRFloatArrayConvertible in_stack_fffffffffffffa00;
  VRDataIndex *in_stack_fffffffffffffa08;
  VRVector3 local_5e8;
  VRVector3 local_5d0;
  VRVector3 local_5b8;
  VRVector3 local_5a0;
  VRVector3 local_588;
  VRMatrix4 local_570;
  VRMatrix4 local_528;
  VRMatrix4 local_4e0;
  float in_stack_fffffffffffffb9c;
  VRVector3 *in_stack_fffffffffffffba0;
  VRPoint3 *in_stack_fffffffffffffba8;
  VRMatrix4 local_450;
  VRMatrix4 local_408;
  VRMatrix4 local_3c0;
  VRMatrix4 local_378;
  VRMatrix4 local_330;
  VRVector3 local_2e8;
  VRPoint3 local_2d0;
  VRVector3 local_2b8;
  VRVector3 local_2a0;
  VRMatrix4 local_288;
  VRVector3 local_240;
  VRVector3 local_228;
  VRVector3 local_210;
  VRVector3 local_1f8;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  undefined1 local_1c9 [40];
  undefined1 local_1a1 [33];
  VRDatum_conflict *local_180;
  vector<float,_std::allocator<float>_> local_178;
  undefined1 local_150 [64];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  VRVector3 *local_10;
  
  local_10 = in_RSI;
  VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffff798);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                          in_stack_fffffffffffff7b8);
  std::__cxx11::string::~string(local_30);
  if ((bVar1 & 1) == 0) {
    VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffff798);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                            in_stack_fffffffffffff7b8);
    std::__cxx11::string::~string(local_50);
    if (_Var2) {
      if (*(int *)((long)&in_RDI[2]._indexName.field_2 + 8) == 1) {
        *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 4;
      }
      else {
        *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 1;
      }
    }
    else {
      VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffff798);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                              in_stack_fffffffffffff7b8);
      std::__cxx11::string::~string(local_70);
      if (_Var2) {
        if (*(int *)((long)&in_RDI[2]._indexName.field_2 + 8) == 0) {
          *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 4;
        }
        else {
          *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 0;
        }
      }
      else {
        VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffff798);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                                in_stack_fffffffffffff7b8);
        std::__cxx11::string::~string(local_90);
        if (_Var2) {
          if (*(int *)((long)&in_RDI[2]._indexName.field_2 + 8) == 2) {
            *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 4;
          }
          else {
            *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 2;
          }
        }
        else {
          VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffff798);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                                  in_stack_fffffffffffff7b8);
          std::__cxx11::string::~string(local_b0);
          if (_Var2) {
            if (*(int *)((long)&in_RDI[2]._indexName.field_2 + 8) == 3) {
              *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 4;
            }
            else {
              *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 3;
            }
          }
          else {
            VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffff798);
            _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0)
                                    ,in_stack_fffffffffffff7b8);
            local_7ed = 0;
            if (_Var2) {
              local_7ed = in_RDI[2]._indexName.field_2._M_local_buf[4] ^ 0xff;
            }
            std::__cxx11::string::~string(local_d0);
            if ((local_7ed & 1) == 0) {
              VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffff798);
              _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffff7c4,
                                                  in_stack_fffffffffffff7c0),
                                      in_stack_fffffffffffff7b8);
              local_7ef = 0;
              if (_Var2) {
                local_7ef = in_RDI[2]._indexName.field_2._M_local_buf[4] ^ 0xff;
              }
              std::__cxx11::string::~string(local_f0);
              if ((local_7ef & 1) == 0) {
                VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffff798);
                _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffff7c4,
                                                    in_stack_fffffffffffff7c0),
                                        in_stack_fffffffffffff7b8);
                bVar8 = 0;
                if (_Var2) {
                  bVar8 = in_RDI[2]._indexName.field_2._M_local_buf[4] ^ 0xff;
                }
                bVar9 = bVar8;
                std::__cxx11::string::~string(local_110);
                if ((bVar8 & 1) == 0) {
                  VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffff798);
                  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_fffffffffffff7c4,
                                                      in_stack_fffffffffffff7c0),
                                          in_stack_fffffffffffff7b8);
                  bVar6 = 0;
                  if (_Var2) {
                    bVar6 = in_RDI[2]._indexName.field_2._M_local_buf[4] ^ 0xff;
                  }
                  bVar7 = bVar6;
                  std::__cxx11::string::~string((string *)(local_150 + 0x20));
                  if ((bVar6 & 1) == 0) {
                    m2 = (VRMatrix4 *)local_150;
                    VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffff798);
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffff7a0,
                                            (char *)in_stack_fffffffffffff798);
                    uVar5 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff808);
                    std::__cxx11::string::~string((string *)local_150);
                    if ((uVar5 & 0x1000000) != 0) {
                      event = (VRDataIndex *)local_1a1;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
                                 in_stack_fffffffffffff7d0);
                      this_01 = (VRVector3 *)local_1c9;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
                                 in_stack_fffffffffffff7d0);
                      v = VRDataIndex::getValue
                                    (in_stack_fffffffffffffa08,
                                     (string *)
                                     in_stack_fffffffffffffa00._vptr_VRFloatArrayConvertible,
                                     in_stack_fffffffffffff9f8,(bool)in_stack_fffffffffffff9f7);
                      local_180 = v.datum;
                      VRDatumConverter::operator_cast_to_vector
                                ((VRDatumConverter<MinVR::VRDatum> *)in_stack_fffffffffffff798);
                      std::__cxx11::string::~string((string *)(local_1c9 + 1));
                      std::allocator<char>::~allocator((allocator<char> *)local_1c9);
                      std::__cxx11::string::~string((string *)(local_1a1 + 1));
                      std::allocator<char>::~allocator((allocator<char> *)local_1a1);
                      bVar3 = std::vector<float,_std::allocator<float>_>::empty
                                        ((vector<float,_std::allocator<float>_> *)
                                         CONCAT44(in_stack_fffffffffffff7b4,
                                                  in_stack_fffffffffffff7b0));
                      if (!bVar3) {
                        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                                           (&local_178,0);
                        local_1d0 = (*pvVar4 - 0.5) * 2.0;
                        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                                           (&local_178,1);
                        local_1d4 = ((1.0 - *pvVar4) - 0.5) * 2.0;
                        if ((in_RDI[2]._indexName.field_2._M_local_buf[0xc] & 1U) != 0) {
                          local_1d8 = local_1d0 -
                                      (float)in_RDI[3]._linkRegister._M_t._M_impl.
                                             super__Rb_tree_header._M_header._M_color;
                          local_1dc = local_1d4 -
                                      *(float *)&in_RDI[3]._linkRegister._M_t._M_impl.
                                                 super__Rb_tree_header._M_header.field_0x4;
                          zz = (float)((ulong)in_stack_fffffffffffff7a0 >> 0x20);
                          if (*(int *)((long)&in_RDI[2]._indexName.field_2 + 8) == 1) {
                            if ((in_RDI[2]._indexName.field_2._M_local_buf[5] & 1U) == 0) {
                              VRVector3::VRVector3
                                        ((VRVector3 *)
                                         CONCAT44(in_stack_fffffffffffff7b4,
                                                  in_stack_fffffffffffff7b0),
                                         in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8,zz);
                              MinVR::operator+((VRVector3 *)
                                               CONCAT44(in_stack_fffffffffffff7ac,
                                                        in_stack_fffffffffffff7a8),
                                               (VRVector3 *)in_stack_fffffffffffff7a0);
                              VRVector3::operator=((VRVector3 *)&in_RDI[2]._overwrite,&local_228);
                              VRVector3::~VRVector3(&local_228);
                              VRVector3::~VRVector3(&local_240);
                            }
                            else {
                              VRVector3::VRVector3
                                        ((VRVector3 *)
                                         CONCAT44(in_stack_fffffffffffff7b4,
                                                  in_stack_fffffffffffff7b0),
                                         in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8,zz);
                              MinVR::operator+((VRVector3 *)
                                               CONCAT44(in_stack_fffffffffffff7ac,
                                                        in_stack_fffffffffffff7a8),
                                               (VRVector3 *)in_stack_fffffffffffff7a0);
                              VRVector3::operator=((VRVector3 *)&in_RDI[2]._overwrite,&local_1f8);
                              VRVector3::~VRVector3(&local_1f8);
                              VRVector3::~VRVector3(&local_210);
                            }
                          }
                          else if (*(int *)((long)&in_RDI[2]._indexName.field_2 + 8) == 2) {
                            VRMatrix4::VRMatrix4(in_stack_fffffffffffff7a0);
                            if ((in_RDI[2]._indexName.field_2._M_local_buf[5] & 1U) == 0) {
                              VRMatrix4::rotationY((float)((ulong)this_01 >> 0x20));
                              VRMatrix4::rotationX((float)((ulong)this_01 >> 0x20));
                              MinVR::operator*((VRMatrix4 *)
                                               CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(bVar7,CONCAT14
                                                  (bVar6,uVar5)))),m2);
                              VRMatrix4::operator=
                                        (in_stack_fffffffffffff7a0,
                                         (VRMatrix4 *)in_stack_fffffffffffff798);
                              VRMatrix4::~VRMatrix4(&local_408);
                              VRMatrix4::~VRMatrix4((VRMatrix4 *)&stack0xfffffffffffffb68);
                              VRMatrix4::~VRMatrix4(&local_450);
                            }
                            else {
                              VRVector3::VRVector3
                                        ((VRVector3 *)
                                         CONCAT44(in_stack_fffffffffffff7b4,
                                                  in_stack_fffffffffffff7b0),
                                         in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8,
                                         (float)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
                              MinVR::operator*((VRMatrix4 *)event,local_10);
                              VRVector3::~VRVector3(&local_2b8);
                              VRVector3::operator[]((VRVector3 *)&in_RDI[2]._overwrite,0);
                              in_stack_fffffffffffff7c8 =
                                   (VRMatrix4 *)
                                   VRVector3::operator[]((VRVector3 *)&in_RDI[2]._overwrite,1);
                              in_stack_fffffffffffff7b4 =
                                   -*(float *)&(in_stack_fffffffffffff7c8->
                                               super_VRFloatArrayConvertible).
                                               _vptr_VRFloatArrayConvertible;
                              VRVector3::operator[]((VRVector3 *)&in_RDI[2]._overwrite,2);
                              VRPoint3::VRPoint3((VRPoint3 *)
                                                 CONCAT44(in_stack_fffffffffffff7b4,
                                                          in_stack_fffffffffffff7b0),
                                                 in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8
                                                 ,(float)((ulong)in_stack_fffffffffffff7a0 >> 0x20))
                              ;
                              VRVector3::cross(this_01,(VRVector3 *)v.datum);
                              VRMatrix4::rotation(in_stack_fffffffffffffba8,
                                                  in_stack_fffffffffffffba0,
                                                  in_stack_fffffffffffffb9c);
                              VRMatrix4::rotation(in_stack_fffffffffffffba8,
                                                  in_stack_fffffffffffffba0,
                                                  in_stack_fffffffffffffb9c);
                              MinVR::operator*((VRMatrix4 *)
                                               CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(bVar7,CONCAT14
                                                  (bVar6,uVar5)))),m2);
                              VRMatrix4::operator=
                                        (in_stack_fffffffffffff7a0,
                                         (VRMatrix4 *)in_stack_fffffffffffff798);
                              VRMatrix4::~VRMatrix4(&local_330);
                              VRMatrix4::~VRMatrix4(&local_3c0);
                              VRMatrix4::~VRMatrix4(&local_378);
                              VRVector3::~VRVector3(&local_2e8);
                              VRPoint3::~VRPoint3(&local_2d0);
                              VRVector3::~VRVector3(&local_2a0);
                            }
                            MinVR::operator*((VRMatrix4 *)
                                             CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(bVar7,CONCAT14(
                                                  bVar6,uVar5)))),m2);
                            VRMatrix4::operator=
                                      (in_stack_fffffffffffff7a0,
                                       (VRMatrix4 *)in_stack_fffffffffffff798);
                            VRMatrix4::~VRMatrix4(&local_4e0);
                            VRMatrix4::~VRMatrix4(&local_288);
                          }
                          else if (*(int *)((long)&in_RDI[2]._indexName.field_2 + 8) == 3) {
                            VRMatrix4::rotationZ((float)((ulong)this_01 >> 0x20));
                            MinVR::operator*((VRMatrix4 *)
                                             CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(bVar7,CONCAT14(
                                                  bVar6,uVar5)))),m2);
                            VRMatrix4::operator=
                                      (in_stack_fffffffffffff7a0,
                                       (VRMatrix4 *)in_stack_fffffffffffff798);
                            VRMatrix4::~VRMatrix4(&local_570);
                            VRMatrix4::~VRMatrix4(&local_528);
                          }
                          else if (*(int *)((long)&in_RDI[2]._indexName.field_2 + 8) == 0) {
                            if ((in_RDI[2]._indexName.field_2._M_local_buf[5] & 1U) == 0) {
                              xx = *(float *)&in_RDI[2]._indexName._M_string_length;
                              VRVector3::VRVector3
                                        ((VRVector3 *)
                                         CONCAT44(in_stack_fffffffffffff7b4,
                                                  in_stack_fffffffffffff7b0),xx,
                                         in_stack_fffffffffffff7a8,zz);
                              MinVR::operator*(xx,(VRVector3 *)in_stack_fffffffffffff7a0);
                              MinVR::operator+((VRVector3 *)CONCAT44(xx,in_stack_fffffffffffff7a8),
                                               (VRVector3 *)in_stack_fffffffffffff7a0);
                              VRVector3::operator=((VRVector3 *)&in_RDI[2]._overwrite,&local_5d0);
                              VRVector3::~VRVector3(&local_5d0);
                              VRVector3::~VRVector3(&local_5e8);
                              VRVector3::~VRVector3((VRVector3 *)&stack0xfffffffffffffa00);
                            }
                            else {
                              in_stack_fffffffffffff7b0 =
                                   (undefined4)in_RDI[2]._indexName._M_string_length;
                              VRVector3::VRVector3
                                        ((VRVector3 *)
                                         CONCAT44(in_stack_fffffffffffff7b4,
                                                  in_stack_fffffffffffff7b0),
                                         in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8,zz);
                              MinVR::operator*(in_stack_fffffffffffff7ac,
                                               (VRVector3 *)in_stack_fffffffffffff7a0);
                              MinVR::operator+((VRVector3 *)
                                               CONCAT44(in_stack_fffffffffffff7ac,
                                                        in_stack_fffffffffffff7a8),
                                               (VRVector3 *)in_stack_fffffffffffff7a0);
                              VRVector3::operator=((VRVector3 *)&in_RDI[2]._overwrite,&local_588);
                              VRVector3::~VRVector3(&local_588);
                              VRVector3::~VRVector3(&local_5a0);
                              VRVector3::~VRVector3(&local_5b8);
                            }
                          }
                          VRMatrix4::translation(this_01);
                          MinVR::operator*((VRMatrix4 *)
                                           CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(bVar7,CONCAT14(
                                                  bVar6,uVar5)))),m2);
                          VRMatrix4::operator=
                                    (in_stack_fffffffffffff7a0,
                                     (VRMatrix4 *)in_stack_fffffffffffff798);
                          VRMatrix4::~VRMatrix4((VRMatrix4 *)&stack0xfffffffffffff9b8);
                          VRMatrix4::~VRMatrix4(&local_690);
                          this_00 = (VRDataIndex *)&in_RDI->_lastDatum;
                          VRMatrix4::toVRFloatArray(in_stack_fffffffffffff7c8);
                          VRTrackerEvent::createValidDataIndex
                                    (in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
                          std::vector<float,_std::allocator<float>_>::~vector
                                    ((vector<float,_std::allocator<float>_> *)
                                     CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
                          VRDataIndex::VRDataIndex
                                    ((VRDataIndex *)CONCAT17(bVar1,in_stack_fffffffffffff820),in_RDI
                                    );
                          VRDataQueue::push((VRDataQueue *)m2,event);
                          VRDataIndex::~VRDataIndex(this_00);
                          VRDataIndex::~VRDataIndex(this_00);
                        }
                        in_RDI[3]._linkRegister._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_color = (_Rb_tree_color)local_1d0;
                        *(float *)&in_RDI[3]._linkRegister._M_t._M_impl.super__Rb_tree_header.
                                   _M_header.field_0x4 = local_1d4;
                      }
                      std::vector<float,_std::allocator<float>_>::~vector
                                ((vector<float,_std::allocator<float>_> *)
                                 CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
                    }
                  }
                  else {
                    *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 4;
                  }
                }
                else {
                  *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 4;
                }
              }
              else {
                *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 4;
              }
            }
            else {
              *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 4;
            }
          }
        }
      }
    }
  }
  else {
    in_RDI[2]._indexName.field_2._M_local_buf[0xc] =
         (in_RDI[2]._indexName.field_2._M_local_buf[0xc] ^ 0xffU) & 1;
    if ((in_RDI[2]._indexName.field_2._M_local_buf[0xc] & 1U) != 0) {
      if ((in_RDI[2]._indexName.field_2._M_local_buf[4] & 1U) == 0) {
        *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 4;
      }
      else {
        *(undefined4 *)((long)&in_RDI[2]._indexName.field_2 + 8) = 0;
      }
    }
  }
  return;
}

Assistant:

void VRFakeTrackerDevice::onVREvent(const VRDataIndex &eventData)
{
  if (eventData.getName() == _toggleEvent) {
    _tracking = !_tracking;
    if (_tracking) {
      if (_sticky) {
        _state = VRFakeTrackerDevice::XYTranslating;
      } else {
        _state = VRFakeTrackerDevice::None;
      }
    }
  }
  else if (eventData.getName() == _translateZOnEvent) {
    if (_state !=  VRFakeTrackerDevice::ZTranslating) {
      _state = VRFakeTrackerDevice::ZTranslating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _translateOnEvent) {
    if (_state != VRFakeTrackerDevice::XYTranslating) {
      _state = VRFakeTrackerDevice::XYTranslating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _rotateOnEvent) {
    if (_state != VRFakeTrackerDevice::Rotating) {
      _state = VRFakeTrackerDevice::Rotating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _rollOnEvent) {
    if (_state != VRFakeTrackerDevice::Rolling) {
      _state = VRFakeTrackerDevice::Rolling;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _translateZOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _translateOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _rotateOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _rollOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == "Mouse_Move") {
    const VRFloatArray screenPos = eventData.getValue("NormalizedPosition");
    if (!screenPos.empty()) {

      // Transform range from [0,1] to [-1,1].
      float mousex = 2.0f * (screenPos[0] - 0.5f);
      float mousey = 2.0f * ((1.0f - screenPos[1]) - 0.5f);

      // If we're not currently tracking, ignore the mouse.
      if (_tracking) {
        float deltaX = mousex - _lastMouseX;
        float deltaY = mousey - _lastMouseY;

        if (_state == VRFakeTrackerDevice::ZTranslating) {
          // If we're Z translating, that's up and down in the seeker mode, but
          // forward and backward in the looker mode.
          if (_seeker) {
            _statePos =  VRVector3(0, _zScale * deltaY, 0) + _statePos;
          } else {
            _statePos =  VRVector3(0, 0, _zScale * deltaY) + _statePos;
          }
        }
        else if (_state == VRFakeTrackerDevice::Rotating) {
          // The seeker mode turns the viewer around in place, while the looker
          // mode rotates the object in front of the viewer.  More or less.

          VRMatrix4 r;

          if (_seeker) {
            VRVector3 up = _stateRot * VRVector3(0.0f, 1.0f, 0.0f);
            // Not sure why these coordinates have to be negated.
            VRPoint3 here = VRPoint3(-_statePos[0], -_statePos[1], -_statePos[2]);
            VRVector3 over = up.cross(_statePos);

            r = VRMatrix4::rotation(here, up, _rScale * deltaX) *
              VRMatrix4::rotation(here, over, _rScale * deltaY);

          } else {
            r = VRMatrix4::rotationY(_rScale * deltaX) *
              VRMatrix4::rotationX(-_rScale * deltaY);
          }
          _stateRot = r * _stateRot;
        }
        else if (_state == VRFakeTrackerDevice::Rolling) {
          VRMatrix4 r = VRMatrix4::rotationZ(_rScale * deltaX);
          _stateRot = r * _stateRot;
        }
        else if (_state == VRFakeTrackerDevice::XYTranslating){
          // The seeker mode moves us in the horizontal plane, while the looker
          // mode moves us in a vertical plane.
          if (_seeker) {
            _statePos =  _xyScale * VRVector3(deltaX, 0, deltaY) + _statePos;
          } else {
            _statePos =  _xyScale * VRVector3(deltaX, deltaY, 0) + _statePos;
          }
        }

        _transform = VRMatrix4::translation(_statePos) * _stateRot;

        VRDataIndex di = VRTrackerEvent::createValidDataIndex(_eventName, _transform.toVRFloatArray());
        _pendingEvents.push(di);
      }

      _lastMouseX = mousex;
      _lastMouseY = mousey;
    }
  }
}